

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

TPZManVector<int,_1000> * __thiscall
TPZManVector<int,_1000>::operator=(TPZManVector<int,_1000> *this,TPZManVector<int,_1000> *copy)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  int *piVar4;
  ulong uVar5;
  
  if (this != copy) {
    uVar1 = (copy->super_TPZVec<int>).fNElements;
    lVar3 = (this->super_TPZVec<int>).fNAlloc;
    if ((lVar3 < (long)uVar1) &&
       (piVar4 = (this->super_TPZVec<int>).fStore, piVar4 != this->fExtAlloc && piVar4 != (int *)0x0
       )) {
      operator_delete__(piVar4);
      lVar3 = 0;
      (this->super_TPZVec<int>).fStore = (int *)0x0;
      (this->super_TPZVec<int>).fNAlloc = 0;
    }
    if ((long)uVar1 < 0x3e9) {
      piVar4 = (this->super_TPZVec<int>).fStore;
      if (piVar4 != (int *)0x0 && piVar4 != this->fExtAlloc) {
        operator_delete__(piVar4);
      }
      (this->super_TPZVec<int>).fNAlloc = 0;
      (this->super_TPZVec<int>).fStore = this->fExtAlloc;
      (this->super_TPZVec<int>).fNElements = uVar1;
      if ((long)uVar1 < 1) {
        return this;
      }
    }
    else {
      if (lVar3 < (long)uVar1) {
        piVar4 = (int *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
        (this->super_TPZVec<int>).fStore = piVar4;
        (this->super_TPZVec<int>).fNAlloc = uVar1;
      }
      (this->super_TPZVec<int>).fNElements = uVar1;
    }
    piVar4 = (copy->super_TPZVec<int>).fStore;
    piVar2 = (this->super_TPZVec<int>).fStore;
    uVar5 = 0;
    do {
      piVar2[uVar5] = piVar4[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}